

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

int mwAssert(int exp,char *exps,char *fn,int ln)

{
  int iVar1;
  char local_838 [8];
  char buffer [2056];
  int i;
  int ln_local;
  char *fn_local;
  char *exps_local;
  int exp_local;
  
  if (exp == 0) {
    mwAutoInit();
    if (mwTestAlways != 0) {
      mwTestNow(fn,ln,1);
    }
    mwIncErr();
    mwCounter = mwCounter + 1;
    mwWrite("assert trap: <%ld> %s(%d), %s\n",mwCounter,fn,(ulong)(uint)ln,exps);
    if (mwAriFunction == (_func_int_char_ptr *)0x0) {
      if ((mwAriAction & 1U) == 0) {
        fprintf(_stderr,"\nMEMWATCH: assert trap: %s(%d), %s\n",fn,(ulong)(uint)ln,exps);
LAB_0010abe9:
        mwFlush();
        mwTestNow(fn,ln,1);
        mwFlush();
        if ((mwAriAction & 0x10U) != 0) {
          mwFlush();
          mwDummy((char)uRam0000000000000000);
        }
        exit(0xff);
      }
      mwWrite("assert trap: <%ld> AUTO IGNORED - execution continues\n",mwCounter);
      exps_local._4_4_ = 0;
    }
    else {
      sprintf(local_838,"MEMWATCH: assert trap: %s(%d), %s",fn,(ulong)(uint)ln,exps);
      iVar1 = (*mwAriFunction)(local_838);
      if (iVar1 == 1) {
        mwWrite("assert trap: <%ld> IGNORED - execution continues\n",mwCounter);
        exps_local._4_4_ = 0;
      }
      else {
        if (iVar1 != 2) goto LAB_0010abe9;
        mwWrite("assert trap: <%ld> RETRY - executing again\n",mwCounter);
        exps_local._4_4_ = 1;
      }
    }
  }
  else {
    exps_local._4_4_ = 0;
  }
  return exps_local._4_4_;
}

Assistant:

int mwAssert(int exp, const char *exps, const char *fn, int ln)
{
	int i;
	char buffer[MW_TRACE_BUFFER + 8];
	if (exp) {
		return 0;
	}
	mwAutoInit();
	MW_MUTEX_LOCK();
	TESTS(fn, ln);
	mwIncErr();
	mwCounter++;
	mwWrite("assert trap: <%ld> %s(%d), %s\n", mwCounter, fn, ln, exps);
	if (mwAriFunction != NULL) {
		sprintf(buffer, "MEMWATCH: assert trap: %s(%d), %s", fn, ln, exps);
		i = (*mwAriFunction)(buffer);
		switch (i) {
			case MW_ARI_IGNORE:
				mwWrite("assert trap: <%ld> IGNORED - execution continues\n", mwCounter);
				MW_MUTEX_UNLOCK();
				return 0;
			case MW_ARI_RETRY:
				mwWrite("assert trap: <%ld> RETRY - executing again\n", mwCounter);
				MW_MUTEX_UNLOCK();
				return 1;
		}
	} else {
		if (mwAriAction & MW_ARI_IGNORE) {
			mwWrite("assert trap: <%ld> AUTO IGNORED - execution continues\n", mwCounter);
			MW_MUTEX_UNLOCK();
			return 0;
		}
		fprintf(mwSTDERR, "\nMEMWATCH: assert trap: %s(%d), %s\n", fn, ln, exps);
	}

	FLUSH();
	(void) mwTestNow(fn, ln, 1);
	FLUSH();

	if (mwAriAction & MW_ARI_NULLREAD) {
		/* This is made in an attempt to kick in */
		/* any debuggers or OS stack traces */
		FLUSH();
		/*lint -save -e413 */
		i = *((int *)NULL);
		mwDummy((char)i);
		/*lint -restore */
	}

	MW_MUTEX_UNLOCK();
	exit(255);
	/* NOT REACHED - the return statement is in to keep */
	/* stupid compilers from squeaking about differing return modes. */
	/* Smart compilers instead say 'code unreachable...' */
	/*lint -save -e527 */
	return 0;
	/*lint -restore */
}